

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

int recff_metacall(jit_State *J,RecordFFData *rd,MMS mm)

{
  TValue TVar1;
  int iVar2;
  TValue argv0;
  TValue TStack_160;
  int errcode;
  RecordIndex ix;
  MMS mm_local;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  ix.oldv._0_4_ = *J->base;
  TStack_160 = *rd->argv;
  ix.idxchain = mm;
  iVar2 = lj_record_mm_lookup(J,(RecordIndex *)&stack0xfffffffffffffea0,mm);
  if (iVar2 == 0) {
    J_local._4_4_ = 0;
  }
  else {
    J->base[2] = *J->base;
    *J->base = ix.val;
    TVar1 = *rd->argv;
    rd->argv[2] = *rd->argv;
    *rd->argv = ix.valv;
    iVar2 = lj_vm_cpcall(J->L,0,J,recff_metacall_cp);
    *rd->argv = TVar1;
    if (iVar2 != 0) {
      lj_err_throw(J->L,iVar2);
    }
    rd->nres = -1;
    J_local._4_4_ = 1;
  }
  return J_local._4_4_;
}

Assistant:

static int recff_metacall(jit_State *J, RecordFFData *rd, MMS mm)
{
  RecordIndex ix;
  ix.tab = J->base[0];
  copyTV(J->L, &ix.tabv, &rd->argv[0]);
  if (lj_record_mm_lookup(J, &ix, mm)) {  /* Has metamethod? */
    int errcode;
    TValue argv0;
    /* Temporarily insert metamethod below object. */
    J->base[1+LJ_FR2] = J->base[0];
    J->base[0] = ix.mobj;
    copyTV(J->L, &argv0, &rd->argv[0]);
    copyTV(J->L, &rd->argv[1+LJ_FR2], &rd->argv[0]);
    copyTV(J->L, &rd->argv[0], &ix.mobjv);
    /* Need to protect lj_record_tailcall because it may throw. */
    errcode = lj_vm_cpcall(J->L, NULL, J, recff_metacall_cp);
    /* Always undo Lua stack changes to avoid confusing the interpreter. */
    copyTV(J->L, &rd->argv[0], &argv0);
    if (errcode)
      lj_err_throw(J->L, errcode);  /* Propagate errors. */
    rd->nres = -1;  /* Pending call. */
    return 1;  /* Tailcalled to metamethod. */
  }
  return 0;
}